

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void MOJOSHADER_effectSetRawValueName
               (MOJOSHADER_effect *effect,char *name,void *data,uint offset,uint len)

{
  int iVar1;
  int local_2c;
  int i;
  uint len_local;
  uint offset_local;
  void *data_local;
  char *name_local;
  MOJOSHADER_effect *effect_local;
  
  local_2c = 0;
  while( true ) {
    if (effect->param_count <= local_2c) {
      __assert_fail("0 && \"Effect parameter not found!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x693,
                    "void MOJOSHADER_effectSetRawValueName(const MOJOSHADER_effect *, const char *, const void *, const unsigned int, const unsigned int)"
                   );
    }
    iVar1 = strcmp(name,effect->params[local_2c].value.name);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  memcpy((void *)((long)effect->params[local_2c].value.field_4.values + (ulong)offset),data,
         (ulong)len);
  return;
}

Assistant:

void MOJOSHADER_effectSetRawValueName(const MOJOSHADER_effect *effect,
                                      const char *name,
                                      const void *data,
                                      const unsigned int offset,
                                      const unsigned int len)
{
    int i;
    for (i = 0; i < effect->param_count; i++)
    {
        if (strcmp(name, effect->params[i].value.name) == 0)
        {
            // !!! FIXME: char* case is arbitary, for Win32 -flibit
            memcpy((char *) effect->params[i].value.values + offset, data, len);
            return;
        } // if
    } // for
    assert(0 && "Effect parameter not found!");
}